

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

int setenv(char *__name,char *__value,int __replace)

{
  void *__ptr;
  bool bVar1;
  int iVar2;
  stCoRoutine_t *psVar3;
  stCoSysEnvArr_t *psVar4;
  void *pvVar5;
  char *pcVar6;
  stCoSysEnvArr_t *arr;
  stCoSysEnv_t name;
  char *local_30;
  undefined8 local_28;
  
  arr = (stCoSysEnvArr_t *)__name;
  if (g_sys_setenv_func == (setenv_pfn_t)0x0) {
    arr = (stCoSysEnvArr_t *)0xffffffffffffffff;
    g_sys_setenv_func = (setenv_pfn_t)dlsym(0xffffffffffffffff,"setenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((bVar1 && _ZL11g_co_sysenv_0 != 0) && (psVar3 = co_self(), psVar3 != (stCoRoutine_t *)0x0)) {
    psVar4 = (stCoSysEnvArr_t *)psVar3->pvEnv;
    if (psVar4 == (stCoSysEnvArr_t *)0x0) {
      psVar4 = dup_co_sysenv_arr(arr);
      psVar3->pvEnv = psVar4;
    }
    local_28 = 0;
    local_30 = __name;
    pvVar5 = bsearch(&local_30,psVar4->data,psVar4->cnt,0x10,co_sysenv_comp);
    if (pvVar5 != (void *)0x0) {
      __ptr = *(void **)((long)pvVar5 + 8);
      if (__replace == 0) {
        if (__ptr != (void *)0x0) {
          return 0;
        }
      }
      else if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pcVar6 = strdup(__value);
      *(char **)((long)pvVar5 + 8) = pcVar6;
      return 0;
    }
  }
  iVar2 = (*g_sys_setenv_func)(__name,__value,__replace);
  return iVar2;
}

Assistant:

int setenv(const char *n, const char *value, int overwrite)
{
	HOOK_SYS_FUNC( setenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();
		if( self )
		{
			if( !self->pvEnv )
			{
				self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
			}
			stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

			stCoSysEnv_t name = { (char*)n,0 };

			stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

			if( e )
			{
				if( overwrite || !e->value  )
				{
					if( e->value ) free( e->value );
					e->value = ( value ? strdup( value ) : 0 );
				}
				return 0;
			}
		}

	}
	return g_sys_setenv_func( n,value,overwrite );
}